

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

int __thiscall kj::WaitScope::poll(WaitScope *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  int extraout_EAX;
  long *in_FS_OFFSET;
  Type local_48;
  undefined1 local_40 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_c__:410:3)>
  _kjDefer410;
  Fault f_1;
  Fault local_18;
  Fault f;
  WaitScope *this_local;
  
  f.exception = (Exception *)this;
  if (this->loop != *(EventLoop **)(*in_FS_OFFSET + -0x10)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x196,FAILED,"&loop == threadLocalEventLoop",
               "\"WaitScope not valid for this thread.\"",
               (char (*) [37])"WaitScope not valid for this thread.");
    _::Debug::Fault::fatal(&local_18);
  }
  if (((this->loop->running ^ 0xffU) & 1) != 0) {
    this->loop->running = true;
    local_48.this = this;
    defer<kj::WaitScope::poll()::__0>((kj *)local_40,&local_48);
    do {
      do {
        bVar1 = EventLoop::turn(this->loop);
      } while (bVar1);
      (*this->loop->port->_vptr_EventPort[1])();
      bVar1 = EventLoop::isRunnable(this->loop);
    } while (bVar1);
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++:410:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_c__:410:3)>
                 *)local_40);
    return extraout_EAX;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            ((Fault *)&_kjDefer410.canceled,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x197,FAILED,"!loop.running","\"poll() is not allowed from within event callbacks.\"",
             (char (*) [51])"poll() is not allowed from within event callbacks.");
  _::Debug::Fault::fatal((Fault *)&_kjDefer410.canceled);
}

Assistant:

void WaitScope::poll() {
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  loop.running = true;
  KJ_DEFER(loop.running = false);

  for (;;) {
    if (!loop.turn()) {
      // No events in the queue.  Poll for I/O.
      loop.port.poll();

      if (!loop.isRunnable()) {
        // Still no events in the queue. We're done.
        return;
      }
    }
  }
}